

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::CSVMultiFileInfo::CreateReader
          (CSVMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *gstate_p,
          BaseUnionData *union_data_p,MultiFileBindData *bind_data)

{
  element_type *peVar1;
  undefined8 uVar2;
  pointer pTVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseFileReader,_true> sVar4;
  undefined1 local_471;
  element_type *local_470;
  ClientContext *local_468;
  CSVSchema *local_460;
  undefined1 local_458 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  CSVReaderOptions options;
  
  local_470 = (element_type *)this;
  local_468 = context;
  pTVar3 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  local_460 = (CSVSchema *)&union_data_p->types;
  CSVReaderOptions::CSVReaderOptions(&options,(CSVReaderOptions *)(union_data_p + 1));
  options.auto_detect = false;
  local_471 = *(undefined1 *)((long)&gstate_p[7]._vptr_GlobalTableFunctionState + 1);
  local_440._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  make_shared_ptr<duckdb::CSVFileScan,duckdb::ClientContext&,std::__cxx11::string_const&,duckdb::CSVReaderOptions,duckdb::MultiFileOptions_const&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CSVSchema&,bool,decltype(nullptr),bool>
            ((ClientContext *)local_458,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
             (CSVReaderOptions *)&union_data_p->file,(MultiFileOptions *)&options,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&bind_data->file_options,(vector<duckdb::LogicalType,_true> *)&union_data_p->names,
             local_460,(bool *)&pTVar3[0x24].column_ids,(void **)&local_471,
             (bool *)(local_458 + 0x18));
  uVar2 = local_458._8_8_;
  peVar1 = local_470;
  local_458._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_470->_vptr_BaseFileReader = (_func_int **)local_458._0_8_;
  (local_470->file).path._M_dataplus._M_p = (pointer)uVar2;
  local_458._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 8));
  CSVReaderOptions::~CSVReaderOptions(&options);
  sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> CSVMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &gstate_p,
                                                          BaseUnionData &union_data_p,
                                                          const MultiFileBindData &bind_data) {
	auto &union_data = union_data_p.Cast<CSVUnionData>();
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	// union readers - use cached options
	auto &csv_names = union_data.names;
	auto &csv_types = union_data.types;
	auto options = union_data.options;
	options.auto_detect = false;
	D_ASSERT(csv_data.csv_schema.Empty());
	return make_shared_ptr<CSVFileScan>(context, union_data.GetFileName(), std::move(options), bind_data.file_options,
	                                    csv_names, csv_types, csv_data.csv_schema, gstate.SingleThreadedRead(), nullptr,
	                                    false);
}